

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O3

msocket_adt_error_t msocket_bytearray_grow(msocket_bytearray_t *self,uint32_t u32MinLen)

{
  uint32_t uVar1;
  uint8_t *__src;
  uint uVar2;
  uint8_t *__dest;
  uint32_t uVar3;
  
  if (self == (msocket_bytearray_t *)0x0) {
    return '\x01';
  }
  if (self->u32AllocLen < u32MinLen) {
    uVar1 = self->u32GrowSize;
    uVar3 = u32MinLen;
    if (uVar1 != 0) {
      uVar3 = self->u32AllocLen - uVar1;
      do {
        uVar3 = uVar3 + uVar1;
      } while (uVar3 < u32MinLen);
    }
    __dest = (uint8_t *)malloc((ulong)uVar3);
    if (__dest == (uint8_t *)0x0) {
      return '\x02';
    }
    __src = self->pData;
    if (__src != (uint8_t *)0x0) {
      uVar2 = self->u32CurLen;
      if (uVar3 <= self->u32CurLen) {
        uVar2 = uVar3;
      }
      memcpy(__dest,__src,(ulong)uVar2);
      free(__src);
    }
    self->pData = __dest;
    self->u32AllocLen = uVar3;
  }
  return '\0';
}

Assistant:

msocket_adt_error_t msocket_bytearray_grow(msocket_bytearray_t *self, uint32_t u32MinLen){
   if( self != 0 ){
      if (u32MinLen > self->u32AllocLen) {
         uint32_t u32NewLen = self->u32AllocLen;
         if (self->u32GrowSize > 0){
            while(u32NewLen<u32MinLen){
               u32NewLen += self->u32GrowSize;
            }
         }
         else
         {
            u32NewLen = u32MinLen;
         }
         return msocket_bytearray_realloc(self, u32NewLen);
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}